

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O2

string_view __thiscall
cinatra::websocket::encode_frame
          (websocket *this,span<char,_18446744073709551615UL> *data,opcode op,bool eof,
          bool need_compression)

{
  string_view sVar1;
  
  sVar1 = encode_ws_header(this,(data->_M_extent)._M_extent_value,op,eof,need_compression,true);
  encode_ws_payload(this,data);
  return sVar1;
}

Assistant:

std::string_view encode_frame(std::span<char> &data, opcode op, bool eof,
                                bool need_compression = false) {
    std::string_view ws_header =
        encode_ws_header(data.size(), op, eof, need_compression);
    encode_ws_payload(data);

    return ws_header;
  }